

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_tree_element_base
              (nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
              nk_collapse_states initial_state,int *selected,char *hash,int len,int line)

{
  nk_style_selectable *style;
  int *piVar1;
  nk_vec2 nVar2;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  nk_user_font *pnVar5;
  nk_rect r;
  nk_rect r_00;
  nk_hash name;
  int iVar6;
  nk_widget_layout_states nVar7;
  int iVar8;
  nk_collapse_states *pnVar9;
  long lVar10;
  nk_uint value;
  char *pcVar11;
  nk_context *in;
  long lVar12;
  nk_command_buffer *b;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  nk_rect nVar17;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect header;
  nk_flags local_8c;
  nk_panel *local_88;
  float local_80;
  float local_7c;
  float local_78;
  nk_flags ws;
  int *local_70;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  char *local_58;
  nk_image *local_50;
  undefined1 local_48 [16];
  
  local_88 = (nk_panel *)CONCAT44(local_88._4_4_,type);
  pnVar3 = ctx->current;
  pcVar11 = title;
  local_70 = selected;
  local_50 = img;
  if (hash == (char *)0x0) {
    len = nk_strlen(title);
    hash = title;
  }
  value = (nk_uint)pcVar11;
  name = nk_murmur_hash(hash,len,line);
  pnVar9 = nk_find_value(pnVar3,name);
  if (pnVar9 == (nk_collapse_states *)0x0) {
    pnVar9 = nk_add_value(ctx,pnVar3,name,value);
    *pnVar9 = initial_state;
  }
  local_58 = title;
  iVar6 = nk_strlen(title);
  ws = 0;
  header.x = 0.0;
  header.y = 0.0;
  header.w = 0.0;
  header.h = 0.0;
  pnVar3 = ctx->current;
  if (pnVar3 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x487c,
                  "int nk_tree_element_image_push_hashed_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, int, enum nk_collapse_states *, int *)"
                 );
  }
  pnVar4 = pnVar3->layout;
  if (pnVar4 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x487d,
                  "int nk_tree_element_image_push_hashed_base(struct nk_context *, enum nk_tree_type, struct nk_image *, const char *, int, enum nk_collapse_states *, int *)"
                 );
  }
  b = &pnVar3->buffer;
  local_80 = (ctx->style).window.spacing.x;
  local_7c = (ctx->style).window.spacing.y;
  local_78 = (ctx->style).selectable.padding.x;
  fVar13 = (ctx->style).tab.padding.y;
  fVar13 = fVar13 + fVar13 + ((ctx->style).font)->height;
  _local_68 = CONCAT44(fStack_64,fVar13);
  nk_layout_set_min_row_height(ctx,fVar13);
  nk_layout_row_dynamic(ctx,local_68,1);
  nk_layout_reset_min_row_height(ctx);
  nVar7 = nk_widget(&header,ctx);
  if ((int)local_88 == 1) {
    if ((ctx->style).tab.background.type == NK_STYLE_ITEM_IMAGE) {
      r.y = header.y;
      r.x = header.x;
      r.w = header.w;
      r.h = header.h;
      nk_draw_image(b,r,&(ctx->style).tab.background.data.image,(nk_color)0xffffffff);
    }
    else {
      nVar17.y = header.y;
      nVar17.x = header.x;
      nVar17.w = header.w;
      nVar17.h = header.h;
      nk_fill_rect(b,nVar17,0.0,(ctx->style).tab.border_color);
      r_00.y = header.y;
      r_00.x = header.x;
      r_00.w = header.w;
      r_00.h = header.h;
      nVar17 = nk_shrink_rect(r_00,(ctx->style).tab.border);
      nk_fill_rect(b,nVar17,(ctx->style).tab.rounding,(ctx->style).tab.background.data.color);
    }
    lVar10 = 0x17c8;
    lVar12 = 0x1878;
  }
  else {
    lVar10 = 0x1928;
    lVar12 = 0x19d8;
  }
  in = (nk_context *)0x0;
  if (nVar7 == NK_WIDGET_VALID && (pnVar4->flags & 0x1000) == 0) {
    in = ctx;
  }
  if (*pnVar9 == NK_MAXIMIZED) {
    lVar12 = lVar10;
  }
  pnVar5 = (ctx->style).font;
  fVar13 = pnVar5->height;
  nVar2 = (ctx->style).tab.padding;
  bounds.x = nVar2.x + header.x;
  bounds.y = nVar2.y + header.y;
  local_48 = ZEXT416((uint)fVar13);
  bounds.h = fVar13;
  bounds.w = fVar13;
  uStack_60 = 0;
  local_88 = pnVar4;
  local_68 = bounds.x;
  fStack_64 = bounds.y;
  iVar8 = nk_do_button_symbol(&ws,b,bounds,(&(ctx->style).tab.sym_minimize)[*pnVar9 == NK_MAXIMIZED]
                              ,NK_BUTTON_DEFAULT,
                              (nk_style_button *)
                              ((long)&(ctx->input).keyboard.keys[0].down + lVar12),&in->input,pnVar5
                             );
  pcVar11 = local_58;
  if (iVar8 != 0) {
    *pnVar9 = (uint)(*pnVar9 != NK_MAXIMIZED);
  }
  style = &(ctx->style).selectable;
  local_8c = 0;
  iVar8 = nk_strlen(local_58);
  pnVar5 = (ctx->style).font;
  fVar14 = (*pnVar5->width)(pnVar5->userdata,pnVar5->height,pcVar11,iVar8);
  fVar14 = local_78 * 4.0 + fVar14;
  fVar13 = local_80 + (float)local_48._0_4_;
  if (local_80 + (float)local_48._0_4_ <= header.w) {
    fVar13 = header.w;
  }
  fVar16 = (float)local_48._0_4_ + local_68 + local_80;
  fVar15 = fVar13 - (local_7c + (float)local_48._0_4_ + (ctx->style).tab.indent);
  if (fVar14 <= fVar15) {
    fVar15 = fVar14;
  }
  pnVar5 = (ctx->style).font;
  header.w = fVar13;
  if (local_50 == (nk_image *)0x0) {
    bounds_00.y = fStack_64;
    bounds_00.x = fVar16;
    bounds_00.w = fVar15;
    bounds_00.h = pnVar5->height;
    nk_do_selectable(&local_8c,b,bounds_00,pcVar11,iVar6,0x11,local_70,style,&in->input,pnVar5);
  }
  else {
    nk_do_selectable_image
              (&local_8c,b,
               (nk_rect)CONCAT88(CONCAT44(pnVar5->height,fVar15),CONCAT44(fStack_64,fVar16)),pcVar11
               ,iVar6,0x11,local_70,local_50,style,&in->input,pnVar5);
  }
  iVar6 = 0;
  if (*pnVar9 == NK_MAXIMIZED) {
    fVar13 = (ctx->style).tab.indent;
    local_88->at_x = (float)*local_88->offset_x + header.x + fVar13;
    fVar14 = (local_88->bounds).w;
    fVar15 = fVar13;
    if (fVar13 <= fVar14) {
      fVar15 = fVar14;
    }
    (local_88->bounds).w = fVar15 - (fVar13 + (ctx->style).window.padding.x);
    piVar1 = &(local_88->row).tree_depth;
    *piVar1 = *piVar1 + 1;
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

NK_INTERN int
nk_tree_element_base(struct nk_context *ctx, enum nk_tree_type type,
    struct nk_image *img, const char *title, enum nk_collapse_states initial_state,
    int *selected, const char *hash, int len, int line)
{
    struct nk_window *win = ctx->current;
    int title_len = 0;
    nk_hash tree_hash = 0;
    nk_uint *state = 0;

    /* retrieve tree state from internal widget state tables */
    if (!hash) {
        title_len = (int)nk_strlen(title);
        tree_hash = nk_murmur_hash(title, (int)title_len, (nk_hash)line);
    } else tree_hash = nk_murmur_hash(hash, len, (nk_hash)line);
    state = nk_find_value(win, tree_hash);
    if (!state) {
        state = nk_add_value(ctx, win, tree_hash, 0);
        *state = initial_state;
    } return nk_tree_element_image_push_hashed_base(ctx, type, img, title,
        nk_strlen(title), (enum nk_collapse_states*)state, selected);
}